

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  cmGlobalUnixMakefileGenerator3 *pcVar2;
  cmake *pcVar3;
  cmState *this_00;
  MacOSXContentGeneratorType *pMVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  PolicyStatus PVar7;
  cmLocalUnixMakefileGenerator3 *pcVar8;
  cmValue cVar9;
  string_view value;
  cmMakefileTargetGenerator *local_58;
  string local_50;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmMakefileTargetGenerator_007a6080;
  (this->BuildFileName)._M_dataplus._M_p = (pointer)&(this->BuildFileName).field_2;
  (this->BuildFileName)._M_string_length = 0;
  (this->BuildFileName).field_2._M_local_buf[0] = '\0';
  (this->BuildFileNameFull)._M_dataplus._M_p = (pointer)&(this->BuildFileNameFull).field_2;
  (this->BuildFileNameFull)._M_string_length = 0;
  (this->BuildFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->ProgressFileNameFull)._M_dataplus._M_p = (pointer)&(this->ProgressFileNameFull).field_2;
  (this->ProgressFileNameFull)._M_string_length = 0;
  (this->ProgressFileNameFull).field_2._M_local_buf[0] = '\0';
  this->CMP0113New = false;
  (this->TargetBuildDirectory)._M_dataplus._M_p = (pointer)&(this->TargetBuildDirectory).field_2;
  (this->TargetBuildDirectory)._M_string_length = 0;
  (this->TargetBuildDirectory).field_2._M_local_buf[0] = '\0';
  (this->TargetBuildDirectoryFull)._M_dataplus._M_p =
       (pointer)&(this->TargetBuildDirectoryFull).field_2;
  (this->TargetBuildDirectoryFull)._M_string_length = 0;
  (this->TargetBuildDirectoryFull).field_2._M_local_buf[0] = '\0';
  (this->BuildFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  (this->FlagFileNameFull)._M_dataplus._M_p = (pointer)&(this->FlagFileNameFull).field_2;
  (this->FlagFileNameFull)._M_string_length = 0;
  (this->FlagFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->FlagFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InfoFileNameFull)._M_dataplus._M_p = (pointer)&(this->InfoFileNameFull).field_2;
  (this->InfoFileNameFull)._M_string_length = 0;
  (this->InfoFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->InfoFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  p_Var1 = &(this->CleanFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmGeneratorTarget::Names::Names(&this->TargetNames);
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->CustomCommandDriver = OnBuild;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OSXBundleGenerator)._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = (cmOSXBundleGenerator *)0x0;
  (this->MacOSXContentGenerator)._M_t.
  super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
  _M_head_impl = (MacOSXContentGeneratorType *)0x0;
  pcVar8 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar8;
  pcVar2 = (cmGlobalUnixMakefileGenerator3 *)
           (pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  pcVar3 = (pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  this->NoRuleMessages = false;
  this_00 = (pcVar3->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"RULE_MESSAGES",(allocator<char> *)&local_58);
  cVar9 = cmState::GetGlobalProperty(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (cVar9.Value != (string *)0x0) {
    value._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar9.Value)->_M_string_length;
    bVar6 = cmValue::IsOff(value);
    this->NoRuleMessages = bVar6;
  }
  PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0113
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if (PVar7 < (REQUIRED_ALWAYS|WARN)) {
    this->CMP0113New = SUB81(0x101010000 >> ((byte)(PVar7 << 3) & 0x3f),0);
  }
  local_58 = this;
  std::make_unique<cmMakefileTargetGenerator::MacOSXContentGeneratorType,cmMakefileTargetGenerator*>
            ((cmMakefileTargetGenerator **)&local_50);
  _Var5._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  pMVar4 = (this->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  (this->MacOSXContentGenerator)._M_t.
  super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
  _M_head_impl = (MacOSXContentGeneratorType *)_Var5._M_p;
  if (pMVar4 != (MacOSXContentGeneratorType *)0x0) {
    (*(pMVar4->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType[1])();
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
{
  this->CustomCommandDriver = OnBuild;
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->GlobalGenerator = static_cast<cmGlobalUnixMakefileGenerator3*>(
    this->LocalGenerator->GetGlobalGenerator());
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if (cmValue ruleStatus =
        cm->GetState()->GetGlobalProperty("RULE_MESSAGES")) {
    this->NoRuleMessages = cmIsOff(*ruleStatus);
  }
  switch (this->GeneratorTarget->GetPolicyStatusCMP0113()) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      this->CMP0113New = false;
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->CMP0113New = true;
      break;
  }
  this->MacOSXContentGenerator =
    cm::make_unique<MacOSXContentGeneratorType>(this);
}